

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmhttpsrv.h
# Opt level: O2

void __thiscall
CVmMetaclassHTTPServer::create_for_image_load(CVmMetaclassHTTPServer *this,vm_obj_id_t id)

{
  undefined8 *puVar1;
  
  puVar1 = (undefined8 *)CVmObject::operator_new(0x10,id);
  *puVar1 = &PTR_get_metaclass_reg_003035e8;
  puVar1[1] = 0;
  *(ushort *)&G_obj_table_X.pages_[id >> 0xc][id & 0xfff].field_0x14 =
       *(ushort *)&G_obj_table_X.pages_[id >> 0xc][id & 0xfff].field_0x14 & 63999;
  *(ushort *)&G_obj_table_X.pages_[id >> 0xc][id & 0xfff].field_0x14 =
       *(ushort *)&G_obj_table_X.pages_[id >> 0xc][id & 0xfff].field_0x14 | 0x80;
  return;
}

Assistant:

void create_for_image_load(VMG_ vm_obj_id_t id)
    {
        new (vmg_ id) CVmObjHTTPServer();
        G_obj_table->set_obj_gc_characteristics(id, FALSE, FALSE);
        G_obj_table->set_obj_transient(id);
    }